

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTests.cpp
# Opt level: O3

void __thiscall
ModelTestFixture_testFindById_Test::TestBody(ModelTestFixture_testFindById_Test *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr *rhs;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  Model<Mock> local_18;
  
  local_18.id = 0;
  local_18._12_4_ = 0;
  if (Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar2 = 1;
  }
  else {
    lVar3 = std::_Rb_tree_decrement
                      (&Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar2 = *(int *)(lVar3 + 0x30) + 1;
  }
  local_18.id = iVar2;
  local_18._vptr_Model = (_func_int **)&PTR_save_00140020;
  Model<Mock>::save(&local_18);
  p_Var4 = &Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (local_18.id <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
    p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < local_18.id];
  } while (p_Var5 != (_Base_ptr)0x0);
  rhs = (_Base_ptr *)0x0;
  if ((int)p_Var4[1]._M_color <= local_18.id) {
    rhs = &p_Var4[1]._M_parent;
  }
  testing::internal::CmpHelperEQ<Mock,Mock>
            (local_28,"object","*Mock::findById(object.getId())",(Mock *)&local_18,(Mock *)rhs);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/tests/base_tests/ModelTests.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ModelTestFixture, testFindById) {
    Mock object = Mock();
    object.save();
    ASSERT_EQ(object, *Mock::findById(object.getId()));
}